

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O2

bufsize_t __thiscall
SectionHdrWrapper::getContentSize(SectionHdrWrapper *this,addr_type aType,bool recalculate)

{
  uint uVar1;
  IMAGE_SECTION_HEADER *pIVar2;
  PEFile *pPVar3;
  int iVar4;
  offset_t oVar5;
  ulong uVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bufsize_t bVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar8;
  SectionHdrWrapper *pSVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  size_t index;
  ulong uVar13;
  long lVar14;
  undefined4 extraout_var;
  
  if ((this->header == (IMAGE_SECTION_HEADER *)0x0) ||
     ((this->super_PENodeWrapper).m_PE == (PEFile *)0x0)) {
    return 0;
  }
  if (!recalculate) {
    if (this->header == (IMAGE_SECTION_HEADER *)0x0) {
      return 0;
    }
    if (aType == RAW) {
      lVar14 = 0x10;
    }
    else {
      if ((aType & ~RAW) != RVA) {
        return 0;
      }
      lVar14 = 8;
    }
    return (ulong)*(uint *)(this->header->Name + lVar14);
  }
  if (aType == RAW) {
    oVar5 = getContentOffset(this,RAW,true);
    if (oVar5 != 0xffffffffffffffff) {
      iVar4 = (*(((this->super_PENodeWrapper).m_PE)->super_MappedExe).super_Executable.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xd])();
      uVar6 = CONCAT44(extraout_var,iVar4);
      uVar12 = uVar6 - oVar5;
      if (((oVar5 <= uVar6) && (pIVar2 = this->header, pIVar2 != (IMAGE_SECTION_HEADER *)0x0)) &&
         (uVar10 = pIVar2->SizeOfRawData, uVar10 != 0)) {
        uVar1 = (pIVar2->Misc).PhysicalAddress;
        if ((pIVar2->Misc).PhysicalAddress == 0) {
          uVar1 = uVar10;
        }
        bVar7 = (bufsize_t)uVar1;
        uVar13 = (ulong)uVar10;
        if (uVar1 < uVar10) {
          uVar13 = bVar7;
        }
        pPVar3 = (this->super_PENodeWrapper).m_PE;
        iVar4 = (*(pPVar3->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                  _vptr_AbstractByteBuffer[0x10])(pPVar3,1);
        if (CONCAT44(extraout_var_00,iVar4) != 0) {
          uVar13 = buf_util::roundupToUnit(uVar13,CONCAT44(extraout_var_00,iVar4));
        }
        if (oVar5 + uVar13 <= uVar6) {
          return uVar13;
        }
        pPVar3 = (this->super_PENodeWrapper).m_PE;
        iVar4 = (*(pPVar3->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                  _vptr_AbstractByteBuffer[0x10])(pPVar3,2);
        if (CONCAT44(extraout_var_01,iVar4) != 0) {
          bVar7 = buf_util::roundupToUnit(bVar7,CONCAT44(extraout_var_01,iVar4));
        }
        uVar6 = bVar7;
        if (uVar12 < bVar7) {
          uVar6 = uVar12;
        }
        if (bVar7 != 0) {
          return uVar6;
        }
        return uVar12;
      }
    }
    return 0;
  }
  if ((aType & ~RAW) != RVA) {
    return 0;
  }
  if (((this->super_PENodeWrapper).m_PE != (PEFile *)0x0) &&
     (pIVar2 = this->header, pIVar2 != (IMAGE_SECTION_HEADER *)0x0)) {
    uVar10 = (pIVar2->Misc).PhysicalAddress;
    uVar1 = pIVar2->VirtualAddress;
    uVar6 = (ulong)uVar1;
    if (uVar10 == 0) {
      uVar10 = pIVar2->SizeOfRawData;
    }
    bVar7 = getMappedRawSize(this);
    if (bVar7 < uVar10) {
      bVar7 = (ulong)uVar10;
    }
    pPVar3 = (this->super_PENodeWrapper).m_PE;
    iVar4 = (*(pPVar3->super_MappedExe).super_Executable.super_AbstractByteBuffer.
              _vptr_AbstractByteBuffer[0x10])(pPVar3,2);
    if (CONCAT44(extraout_var_02,iVar4) != 0) {
      bVar7 = buf_util::roundupToUnit(bVar7,CONCAT44(extraout_var_02,iVar4));
    }
    iVar4 = (*(((this->super_PENodeWrapper).m_PE)->super_MappedExe).super_Executable.
              super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x13])();
    uVar12 = CONCAT44(extraout_var_03,iVar4);
    if (uVar6 <= uVar12) {
      uVar13 = bVar7 + uVar6;
      sVar8 = PEFile::_getSectionsCount((this->super_PENodeWrapper).m_PE,true);
      for (index = 0; sVar8 != index; index = index + 1) {
        pSVar9 = PEFile::_getSecHdr((this->super_PENodeWrapper).m_PE,index);
        if ((pSVar9 != (SectionHdrWrapper *)0x0) && (pSVar9->header != (IMAGE_SECTION_HEADER *)0x0))
        {
          uVar10 = pSVar9->header->VirtualAddress;
          uVar11 = (ulong)uVar10;
          if (uVar13 < uVar10) {
            uVar11 = uVar13;
          }
          if (uVar1 < uVar10) {
            uVar13 = uVar11;
          }
        }
      }
      if (uVar13 < uVar12) {
        uVar12 = uVar13;
      }
      return uVar12 - uVar6;
    }
  }
  return 0;
}

Assistant:

bufsize_t SectionHdrWrapper::getContentSize(Executable::addr_type aType, bool recalculate)
{
    if (!this->header || !m_PE) return 0;

    bufsize_t size = 0;
    if (!recalculate) {
        size = getContentDeclaredSize(aType);
        //printf("Declared size = %llx\n---\n", size);
        return size;
    }
    //---
    if (aType == Executable::RAW) {
        //printf ("R: ");
        size = getMappedRawSize();
    }
    if (aType == Executable::RVA || aType == Executable::VA) {
        size = getMappedVirtualSize();
        //printf ("V: ");
    }
    //printf("Mapped size = %llx\n", size);
    return size;
}